

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::releaseKeyboard(QWidget *this)

{
  long lVar1;
  
  if (keyboardGrb != this) {
    return;
  }
  lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x78);
  if (((lVar1 == 0) || (lVar1 = *(long *)(lVar1 + 8), lVar1 == 0)) ||
     (lVar1 = *(long *)(lVar1 + 0x20), lVar1 == 0)) {
    do {
      this = *(QWidget **)(*(long *)&this->field_0x8 + 0x10);
      if (this == (QWidget *)0x0) {
        keyboardGrb = (QWidget *)0x0;
        return;
      }
    } while (this->data->winid == 0);
    lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x78);
    if (lVar1 == 0) {
      keyboardGrb = (QWidget *)0x0;
      return;
    }
    lVar1 = *(long *)(lVar1 + 8);
    if (lVar1 == 0) {
      keyboardGrb = (QWidget *)0x0;
      return;
    }
    lVar1 = *(long *)(lVar1 + 0x20);
    if (lVar1 == 0) {
      keyboardGrb = (QWidget *)0x0;
      return;
    }
  }
  QWindow::setKeyboardGrabEnabled(SUB81(lVar1,0));
  keyboardGrb = (QWidget *)0x0;
  return;
}

Assistant:

void QWidget::releaseKeyboard()
{
    if (keyboardGrb == this) {
        if (QWindow *window = grabberWindow(this))
            window->setKeyboardGrabEnabled(false);
        keyboardGrb = nullptr;
    }
}